

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

void __thiscall
duckdb::DataTable::DataTable
          (DataTable *this,ClientContext *context,DataTable *parent,idx_t removed_column)

{
  vector<duckdb::ColumnDefinition,_true> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pCVar2;
  pointer puVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  DuckTransaction *this_01;
  LocalStorage *this_02;
  DataTableInfo *pDVar9;
  type pIVar10;
  reference this_03;
  RowGroupCollection *col_idx;
  CatalogException *pCVar11;
  ulong *puVar12;
  pointer this_04;
  pointer this_05;
  storage_t storage_oid;
  AttachedDatabase *db;
  size_type __n;
  undefined1 local_108 [32];
  LogicalType local_e8 [2];
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_b0;
  Value local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  (this->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  db = parent->db;
  this->db = db;
  (this->info).internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (parent->info).internal.
         super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (parent->info).internal.
           super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->info).internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      db = this->db;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this_00 = &this->column_definitions;
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->append_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->append_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->append_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->append_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->append_lock).super___mutex_base._M_mutex.__align = 0;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->version)._M_i = MAIN_TABLE;
  this_01 = DuckTransaction::Get(context,db);
  this_02 = DuckTransaction::GetLocalStorage(this_01);
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&parent->append_lock);
  if (iVar8 != 0) {
    ::std::__throw_system_error(iVar8);
  }
  this_05 = (parent->column_definitions).
            super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
            super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (parent->column_definitions).
           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_05 != pCVar2) {
    do {
      ColumnDefinition::Copy((ColumnDefinition *)local_108,this_05);
      ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::
      emplace_back<duckdb::ColumnDefinition>
                (&this_00->
                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>,
                 (ColumnDefinition *)local_108);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(local_108 + 0xa0));
      Value::~Value((Value *)(local_108 + 0x60));
      if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           )local_b0._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
      local_b0._M_head_impl = (ParsedExpression *)0x0;
      LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
      if ((element_type *)local_108._0_8_ != (element_type *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_);
      }
      this_05 = this_05 + 1;
    } while (this_05 != pCVar2);
  }
  pDVar9 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  TableIndexList::InitializeIndexes(&pDVar9->indexes,context,pDVar9,(char *)0x0);
  pDVar9 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&pDVar9->indexes);
  if (iVar8 == 0) {
    this_04 = (pDVar9->indexes).indexes.
              super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (pDVar9->indexes).indexes.
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (this_04 == puVar3) {
        pthread_mutex_unlock((pthread_mutex_t *)&pDVar9->indexes);
        vector<duckdb::ColumnDefinition,_true>::erase_at(this_00,removed_column);
        if ((this->column_definitions).
            super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
            super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (this->column_definitions).
            super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
            super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          __n = 0;
          storage_oid = 0;
          do {
            this_03 = vector<duckdb::ColumnDefinition,_true>::operator[](this_00,__n);
            ColumnDefinition::SetOid(this_03,__n);
            bVar7 = ColumnDefinition::Generated(this_03);
            if (!bVar7) {
              ColumnDefinition::SetStorageOid(this_03,storage_oid);
              storage_oid = storage_oid + 1;
            }
            __n = __n + 1;
          } while (__n < (ulong)(((long)(this->column_definitions).
                                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                        .
                                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->column_definitions).
                                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                        .
                                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x7b425ed097b425ed));
        }
        col_idx = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&parent->row_groups);
        RowGroupCollection::RemoveColumn((RowGroupCollection *)local_108,(idx_t)col_idx);
        uVar6 = local_108._8_8_;
        uVar5 = local_108._0_8_;
        local_108._0_8_ = (pointer)0x0;
        local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var1 = (this->row_groups).internal.
                 super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (this->row_groups).internal.
        super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar5;
        (this->row_groups).internal.
        super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
          }
        }
        LocalStorage::DropColumn(this_02,parent,this,removed_column);
        LOCK();
        (parent->version)._M_i = ALTERED;
        UNLOCK();
        pthread_mutex_unlock((pthread_mutex_t *)&parent->append_lock);
        return;
      }
      pIVar10 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                          (this_04);
      for (puVar12 = (pIVar10->column_ids).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
          puVar12 !=
          (pIVar10->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; puVar12 = puVar12 + 1) {
        uVar4 = *puVar12;
        if (uVar4 == removed_column) {
          pCVar11 = (CatalogException *)__cxa_allocate_exception(0x10);
          local_108._0_8_ = local_108 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,"Cannot drop this column: an index depends on it!","");
          CatalogException::CatalogException(pCVar11,(string *)local_108);
          __cxa_throw(pCVar11,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (removed_column <= uVar4 && uVar4 != removed_column) {
          pCVar11 = (CatalogException *)__cxa_allocate_exception(0x10);
          local_108._0_8_ = local_108 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_108,
                     "Cannot drop this column: an index depends on a column after it!","");
          CatalogException::CatalogException(pCVar11,(string *)local_108);
          __cxa_throw(pCVar11,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      this_04 = this_04 + 1;
    } while( true );
  }
  ::std::__throw_system_error(iVar8);
}

Assistant:

DataTable::DataTable(ClientContext &context, DataTable &parent, idx_t removed_column)
    : db(parent.db), info(parent.info), version(DataTableVersion::MAIN_TABLE) {
	// prevent any new tuples from being added to the parent
	auto &local_storage = LocalStorage::Get(context, db);
	lock_guard<mutex> parent_lock(parent.append_lock);

	for (auto &column_def : parent.column_definitions) {
		column_definitions.emplace_back(column_def.Copy());
	}

	info->InitializeIndexes(context);

	// first check if there are any indexes that exist that point to the removed column
	info->indexes.Scan([&](Index &index) {
		for (auto &column_id : index.GetColumnIds()) {
			if (column_id == removed_column) {
				throw CatalogException("Cannot drop this column: an index depends on it!");
			} else if (column_id > removed_column) {
				throw CatalogException("Cannot drop this column: an index depends on a column after it!");
			}
		}
		return false;
	});

	// erase the column definitions from this DataTable
	D_ASSERT(removed_column < column_definitions.size());
	column_definitions.erase_at(removed_column);

	storage_t storage_idx = 0;
	for (idx_t i = 0; i < column_definitions.size(); i++) {
		auto &col = column_definitions[i];
		col.SetOid(i);
		if (col.Generated()) {
			continue;
		}
		col.SetStorageOid(storage_idx++);
	}

	// alter the row_groups and remove the column from each of them
	this->row_groups = parent.row_groups->RemoveColumn(removed_column);

	// scan the original table, and fill the new column with the transformed value
	local_storage.DropColumn(parent, *this, removed_column);

	// this table replaces the previous table, hence the parent is no longer the root DataTable
	parent.version = DataTableVersion::ALTERED;
}